

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImGui::RoundScalarWithFormatT<int,int>(char *format,ImGuiDataType data_type,int v)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  undefined4 local_5c;
  char v_str [64];
  
  local_5c = v;
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    ImFormatString(v_str,0x40,pcVar2,(ulong)(uint)v);
    pcVar2 = (char *)((long)&local_5c + 3);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 4) {
      dVar3 = atof(pcVar2);
      v = (int)dVar3;
    }
    else {
      ImAtoi<int>(pcVar2,&local_5c);
      v = local_5c;
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}